

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::
AddTestPattern(ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_> *this,
              char *test_suite_name,char *test_base_name,
              TestMetaFactoryBase<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
              *meta_factory,CodeLocation *code_location)

{
  pointer psVar1;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_> *pPVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ulong uVar5;
  pointer psVar6;
  pointer psVar7;
  pointer psVar8;
  pointer psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar10;
  ulong uVar11;
  allocator local_69;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  int local_48;
  pointer local_40;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_> *local_38;
  
  peVar3 = (element_type *)operator_new(0x70);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,meta_factory->_vptr_TestMetaFactoryBase,
             (long)meta_factory[1]._vptr_TestMetaFactoryBase +
             (long)meta_factory->_vptr_TestMetaFactoryBase);
  local_48 = *(int *)&meta_factory[4]._vptr_TestMetaFactoryBase;
  (peVar3->test_suite_base_name)._M_dataplus._M_p = (pointer)&(peVar3->test_suite_base_name).field_2
  ;
  (peVar3->test_suite_base_name).field_2._M_allocated_capacity = 0x5465676172657641;
  *(undefined8 *)((long)&(peVar3->test_suite_base_name).field_2 + 7) = 0x7070623874736554;
  (peVar3->test_suite_base_name)._M_string_length = 0xf;
  (peVar3->test_suite_base_name).field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)&peVar3->test_base_name,test_suite_name,&local_69);
  (peVar3->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>_*,_false>
       = (_Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>_*,_false>
          )test_base_name;
  (peVar3->code_location).file._M_dataplus._M_p = (pointer)&(peVar3->code_location).file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&peVar3->code_location,local_68,local_68 + local_60);
  (peVar3->code_location).line = local_48;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0109a490;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)peVar3;
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == (this->tests_).
                super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    psVar9 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = this;
    if ((long)psVar1 - (long)psVar9 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar10 = (long)psVar1 - (long)psVar9 >> 4;
    uVar5 = 1;
    if (psVar1 != psVar9) {
      uVar5 = uVar10;
    }
    uVar11 = uVar5 + uVar10;
    if (0x7fffffffffffffe < uVar11) {
      uVar11 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar5,uVar10)) {
      uVar11 = 0x7ffffffffffffff;
    }
    if (uVar11 == 0) {
      psVar6 = (pointer)0x0;
    }
    else {
      local_40 = psVar9;
      psVar6 = (pointer)operator_new(uVar11 << 4);
      psVar9 = local_40;
    }
    pPVar2 = local_38;
    psVar6[uVar10].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar3;
    psVar6[uVar10].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var4;
    psVar8 = psVar6;
    for (psVar7 = psVar9; psVar1 != psVar7; psVar7 = psVar7 + 1) {
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peVar3 = (psVar7->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var4 = (psVar7->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (psVar7->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar3;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = p_Var4;
      (psVar7->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)0x0;
      psVar8 = psVar8 + 1;
    }
    if (psVar9 != (pointer)0x0) {
      operator_delete(psVar9);
    }
    (pPVar2->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar6;
    (pPVar2->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar8 + 1;
    (pPVar2->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar6 + uVar11;
  }
  else {
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar3;
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = p_Var4;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AverageTest<unsigned_char>_>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1 + 1;
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }